

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskFileIndex.cpp
# Opt level: O2

string * __thiscall
OnDiskFileIndex::get_file_name_abi_cxx11_
          (string *__return_storage_ptr__,OnDiskFileIndex *this,FileId fid)

{
  __off_t in_R8;
  uint64_t ptrs [2];
  
  RawFile::pread((RawFile *)&this->cache_file,(int)ptrs,(void *)0x10,(ulong)fid << 3,in_R8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct
            ((ulong)__return_storage_ptr__,(char)(void *)(~ptrs[0] + ptrs[1]));
  RawFile::pread(&this->files_file,(int)(__return_storage_ptr__->_M_dataplus)._M_p,
                 (void *)(~ptrs[0] + ptrs[1]),ptrs[0],in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string OnDiskFileIndex::get_file_name(FileId fid) const {
    uint64_t ptrs[2];
    cache_file->pread(&ptrs, sizeof(ptrs), fid * sizeof(uint64_t));

    uint64_t filename_start = ptrs[0];
    uint64_t filename_end = ptrs[1] - 1;
    uint64_t filename_length = filename_end - filename_start;

    std::string filename(filename_length, '\x00');
    files_file.pread(filename.data(), filename_length, filename_start);
    return filename;
}